

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alSource3f(ALuint name,ALenum param,ALfloat value1,ALfloat value2,ALfloat value3)

{
  APILOCK();
  IO_ENTRYINFO(ALEE_alSource3f);
  writele32(name);
  writele32(param);
  writele32((uint32)value1);
  writele32((uint32)value2);
  writele32((uint32)value3);
  (*REAL_alSource3f)(name,param,value1,value2,value3);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSource3f(ALuint name, ALenum param, ALfloat value1, ALfloat value2, ALfloat value3)
{
    IO_START(alSource3f);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_FLOAT(value1);
    IO_FLOAT(value2);
    IO_FLOAT(value3);
    REAL_alSource3f(name, param, value1, value2, value3);
    check_source_state_from_name(name);
    IO_END();
}